

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O2

void __thiscall
TEST_DoublingFactorCounterTest_AllTerminals_Test::~TEST_DoublingFactorCounterTest_AllTerminals_Test
          (TEST_DoublingFactorCounterTest_AllTerminals_Test *this)

{
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::
  ~TEST_GROUP_CppUTestGroupDoublingFactorCounterTest
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest);
  operator_delete(this,0xc0);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, AllTerminals)
{
	addPair(Tile::OneOfCharacters);
	addTriplet(Tile::NineOfCharacters, false);
	addTriplet(Tile::OneOfCircles, false);
	addTriplet(Tile::OneOfBamboos, false);
	addTriplet(Tile::NineOfBamboos, false);	

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::AllTerminals));
	CHECK_EQUAL(100, r.doubling_factor);
}